

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O2

FakePropertyGuardWeakReference *
Js::FakePropertyGuardWeakReference::New(Recycler *recycler,PropertyGuard *guard)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  FakePropertyGuardWeakReference *pFVar4;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (guard == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/PropertyGuard.h"
                                ,0x87,"(guard != nullptr)","guard != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2a0df68;
  data.filename._0_4_ = 0x88;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  pFVar4 = (FakePropertyGuardWeakReference *)new<Memory::Recycler>(0x28,alloc,0x6db486);
  (pFVar4->super_RecyclerWeakReference<Js::PropertyGuard>).super_RecyclerWeakReferenceBase.strongRef
       = (Type)guard;
  (pFVar4->super_RecyclerWeakReference<Js::PropertyGuard>).super_RecyclerWeakReferenceBase.
  strongRefHeapBlock = &Memory::CollectedRecyclerWeakRefHeapBlock::Instance.super_HeapBlock;
  return pFVar4;
}

Assistant:

static FakePropertyGuardWeakReference* New(Recycler* recycler, Js::PropertyGuard* guard)
    {
        Assert(guard != nullptr);
        return RecyclerNewLeaf(recycler, Js::FakePropertyGuardWeakReference, guard);
    }